

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O2

bool __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::insert_media
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this,Media *media)

{
  element_type *peVar1;
  bool bVar2;
  undefined8 *puVar3;
  Drive *this_00;
  pointer device;
  
  if ((media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((media->mass_storage_devices).
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (media->mass_storage_devices).
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
  }
  else {
    bVar2 = Storage::Disk::Drive::has_disk((Drive *)&this->field_0xe28);
    this_00 = (Drive *)&this->field_0xfa0;
    if (!bVar2) {
      this_00 = (Drive *)&this->field_0xe28;
    }
    Storage::Disk::Drive::set_disk
              (this_00,(media->disks).
                       super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  device = (media->mass_storage_devices).
           super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (device != (media->mass_storage_devices).
                super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    peVar1 = (device->
             super___shared_ptr<Storage::MassStorage::MassStorageDevice,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if ((peVar1 != (element_type *)0x0) &&
       (puVar3 = (undefined8 *)
                 __dynamic_cast(peVar1,&Storage::MassStorage::MassStorageDevice::typeinfo,
                                &Storage::MassStorage::Encodings::Macintosh::Volume::typeinfo,
                                0xfffffffffffffffe), puVar3 != (undefined8 *)0x0)) {
      (**(code **)*puVar3)(puVar3,0);
      device = (media->mass_storage_devices).
               super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    SCSI::DirectAccessDevice::set_storage(&(this->hard_drive_).executor_,device);
  }
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(media.disks.empty() && media.mass_storage_devices.empty())
				return false;

			// TODO: shouldn't allow disks to be replaced like this, as the Mac
			// uses software eject. Will need to expand messaging ability of
			// insert_media.
			if(!media.disks.empty()) {
				if(drives_[0].has_disk())
					drives_[1].set_disk(media.disks[0]);
				else
					drives_[0].set_disk(media.disks[0]);
			}

			// TODO: allow this only at machine startup?
			if(!media.mass_storage_devices.empty()) {
				const auto volume = dynamic_cast<Storage::MassStorage::Encodings::Macintosh::Volume *>(media.mass_storage_devices.front().get());
				if(volume) {
					volume->set_drive_type(Storage::MassStorage::Encodings::Macintosh::DriveType::SCSI);
				}
				hard_drive_->set_storage(media.mass_storage_devices.front());
			}

			return true;
		}